

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tuple<testing::Matcher<int>,testing::Matcher<BasicTestExpr<1>>>,std::tuple<int,BasicTestExpr<1>>>
               (tuple<testing::Matcher<int>,_testing::Matcher<BasicTestExpr<1>_>_> *matcher_tuple,
               tuple<int,_BasicTestExpr<1>_> *value_tuple)

{
  MatcherInterface<int> *pMVar1;
  MatcherInterface<BasicTestExpr<1>_> *pMVar2;
  undefined1 uVar3;
  int iVar4;
  DummyMatchResultListener dummy;
  
  pMVar1 = (matcher_tuple->
           super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<BasicTestExpr<1>_>_>).
           super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
           impl_.value_;
  iVar4 = (*(pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                    (pMVar1,(ulong)(uint)(value_tuple->
                                         super__Tuple_impl<0UL,_int,_BasicTestExpr<1>_>).
                                         super__Head_base<0UL,_int,_false>._M_head_impl);
  if ((char)iVar4 == '\0') {
    uVar3 = 0;
  }
  else {
    pMVar2 = (matcher_tuple->
             super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<BasicTestExpr<1>_>_>).
             super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>_>.
             super__Head_base<1UL,_testing::Matcher<BasicTestExpr<1>_>,_false>._M_head_impl.
             super_MatcherBase<BasicTestExpr<1>_>.impl_.value_;
    uVar3 = (**(code **)(*(long *)pMVar2 + 0x20))
                      (pMVar2,(value_tuple->super__Tuple_impl<0UL,_int,_BasicTestExpr<1>_>).
                              super__Tuple_impl<1UL,_BasicTestExpr<1>_>.
                              super__Head_base<1UL,_BasicTestExpr<1>,_false>);
  }
  return (bool)uVar3;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    using ::std::tr1::get;
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple)
        && get<N - 1>(matcher_tuple).Matches(get<N - 1>(value_tuple));
  }